

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O2

int (anonymous_namespace)::store_bool<int,char>(int *out,char *val)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  
  iVar2 = 3;
  if (out != (int *)0x0) {
    bVar1 = anon_unknown.dwarf_a9c0::strmatch("false",(char *)out);
    uVar3 = 0;
    if ((!bVar1) && (bVar1 = anon_unknown.dwarf_a9c0::strmatch("0",(char *)out), !bVar1)) {
      bVar1 = anon_unknown.dwarf_a9c0::strmatch("true",(char *)out);
      uVar3 = 1;
      if ((!bVar1) && (bVar1 = anon_unknown.dwarf_a9c0::strmatch("1",(char *)out), !bVar1)) {
        return 3;
      }
    }
    iVar2 = 0;
    global_state_singleton._56_4_ = uVar3;
  }
  return iVar2;
}

Assistant:

int store_bool(INT_T *out, const CHAR_T *val)
{
    static const char* const s_zero  = "0";
    static const char* const s_one   = "1";
    static const char* const s_true  = "true";
    static const char* const s_false = "false";
    
    if (val == 0)
        return __CILKRTS_SET_PARAM_INVALID;

    if (strmatch(s_false, val) || strmatch(s_zero, val)) { 
        *out = 0;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    if (strmatch(s_true, val) || strmatch(s_one, val)) { 
        *out = 1;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    return __CILKRTS_SET_PARAM_INVALID;
}